

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm_decode_ioctl.c
# Opt level: O1

int decode_nvrm_ioctl(uint32_t fd,uint32_t id,uint8_t dir,uint8_t nr,uint16_t size,mmt_buf *buf,
                     uint64_t ret,uint64_t err,void *state,mmt_memory_dump *args,int argc,char *name
                     )

{
  byte bVar1;
  bool bVar2;
  long lVar3;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  int *piVar4;
  nvrm_ioctl *unaff_RBP;
  undefined6 in_register_00000082;
  int iVar5;
  
  piVar4 = (int *)CONCAT71(in_register_00000011,dir);
  lVar3 = (long)nvrm_ioctls_cnt;
  bVar1 = 1;
  if (lVar3 < 1) {
    bVar2 = true;
  }
  else {
    unaff_RBP = nvrm_ioctls;
    do {
      if (unaff_RBP->id == id) {
        if (unaff_RBP->size == *piVar4) {
          if ((dump_decoded_ioctl_data == 0) || (unaff_RBP->disabled != 0)) {
            bVar2 = false;
          }
          else {
            if (indent_logs == 0) {
              fprintf(_stdout,"LOG: %-26s %-5s fd: %d, ",unaff_RBP->name,err,(ulong)fd);
            }
            else {
              fprintf(_stdout,"%64s%-26s %-5s fd: %d, "," ");
            }
            if (CONCAT71(in_register_00000009,nr) != 0) {
              fprintf(_stdout,"ret: %ld, ",CONCAT71(in_register_00000009,nr));
            }
            if (CONCAT62(in_register_00000082,size) != 0) {
              fprintf(_stdout,"%serr: %ld%s, ",colors->err,CONCAT62(in_register_00000082,size),
                      colors->reset);
            }
            nvrm_pfx = "";
            if ((code *)unaff_RBP->fun != (code *)0x0) {
              (*(code *)unaff_RBP->fun)(piVar4 + 1);
            }
            if ((code *)unaff_RBP->fun_with_args == (code *)0x0) {
              bVar2 = false;
            }
            else {
              (*(code *)unaff_RBP->fun_with_args)(piVar4 + 1,buf,ret & 0xffffffff);
              bVar2 = false;
              bVar1 = 0;
            }
          }
        }
        else {
          bVar2 = true;
        }
        goto LAB_00259329;
      }
      unaff_RBP = unaff_RBP + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    bVar2 = true;
    unaff_RBP = nvrm_ioctls + (nvrm_ioctls_cnt - 1);
  }
LAB_00259329:
  iVar5 = 1;
  if (!bVar2) {
    if ((((bool)(bVar1 & dump_decoded_ioctl_data != 0)) && (unaff_RBP->disabled == 0)) ||
       (dump_raw_ioctl_data != 0)) {
      iVar5 = 0;
      dump_args((mmt_memory_dump *)buf,(int)ret,0);
    }
    else {
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

static int decode_nvrm_ioctl(uint32_t fd, uint32_t id, uint8_t dir, uint8_t nr,
		uint16_t size, struct mmt_buf *buf, uint64_t ret, uint64_t err,
		void *state, struct mmt_memory_dump *args, int argc, const char *name)
{
	int k, found = 0;
	int args_used = 0;
	void (*fun)(void *) = NULL;
	void (*fun_with_args)(void *, struct mmt_memory_dump *, int argc) = NULL;

	struct nvrm_ioctl *ioctl;
	for (k = 0; k < nvrm_ioctls_cnt; ++k)
	{
		ioctl = &nvrm_ioctls[k];
		if (ioctl->id == id)
		{
			if (ioctl->size == buf->len)
			{
				if (dump_decoded_ioctl_data && !ioctl->disabled)
				{
					mmt_log("%-26s %-5s fd: %d, ", ioctl->name, name, fd);
					if (ret)
						mmt_log_cont("ret: %" PRId64 ", ", ret);
					if (err)
						mmt_log_cont("%serr: %" PRId64 "%s, ", colors->err, err, colors->reset);

					nvrm_reset_pfx();
					fun = ioctl->fun;
					if (fun)
						fun(buf->data);
					fun_with_args = ioctl->fun_with_args;
					if (fun_with_args)
					{
						fun_with_args(buf->data, args, argc);
						args_used = 1;
					}
				}
				found = 1;
			}
			break;
		}
	}

	if (!found)
		return 1;

	if ((!args_used && dump_decoded_ioctl_data && !ioctl->disabled) || dump_raw_ioctl_data)
		dump_args(args, argc, 0);

	return 0;
}